

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O0

int getTankValue(int param,Node *node,double *value,Network *nw)

{
  int iVar1;
  double dVar2;
  double dVar3;
  string local_60 [4];
  int index;
  string name;
  Tank *tank;
  double vcf;
  double lcf;
  Network *nw_local;
  double *value_local;
  Node *node_local;
  int param_local;
  
  dVar2 = Network::ucf(nw,LENGTH);
  dVar3 = dVar2 * dVar2 * dVar2;
  *value = 0.0;
  iVar1 = (*(node->super_Element)._vptr_Element[2])();
  if (iVar1 == 1) {
    switch(param) {
    case 8:
      *value = (node->head - node->elev) * dVar2;
      break;
    default:
      return 0xcb;
    case 0xe:
      dVar2 = Tank::findVolume((Tank *)node,node->head);
      *value = dVar2 * dVar3;
      break;
    case 0xf:
      *value = (double)*(int *)&node[1].xCoord;
      break;
    case 0x10:
      *value = node[1].initQual * node[1].fullDemand * dVar3;
      break;
    case 0x11:
      *value = *(double *)&node[1].super_Element.field_0x18 * dVar2;
      break;
    case 0x12:
      *value = *(double *)&node[1].super_Element.field_0x20 * dVar3;
      break;
    case 0x13:
      if (node[1].elev == 0.0) {
        *value = -1.0;
      }
      else {
        std::__cxx11::string::string(local_60,(string *)((long)node[1].elev + 8));
        iVar1 = Network::indexOf(nw,CURVE,(string *)local_60);
        *value = (double)iVar1;
        if (iVar1 < 0) {
          node_local._4_4_ = 0xcd;
        }
        std::__cxx11::string::~string(local_60);
        if (iVar1 < 0) {
          return node_local._4_4_;
        }
      }
      break;
    case 0x14:
      *value = (*(double *)&node[1].super_Element.name - node->elev) * dVar2;
      break;
    case 0x15:
      *value = (*(double *)&node[1].super_Element.field_0x10 - node->elev) * dVar2;
      break;
    case 0x16:
      *value = node[1].initQual;
      break;
    case 0x17:
      *value = *(double *)&node[1].super_Element.index;
      break;
    case 0x18:
      *value = node[1].actualDemand * dVar3;
    }
  }
  return 0;
}

Assistant:

int getTankValue(int param, Node* node, double* value, Network* nw)
{
    double lcf = nw->ucf(Units::LENGTH);
    double vcf = lcf * lcf * lcf;
    *value = 0.0;
    if ( node->type() != Node::TANK ) return 0;
    Tank* tank = static_cast<Tank*>(node);
    switch (param)
    {
    case EN_TANKLEVEL:
        *value = (tank->head - tank->elev) * lcf;
        break;
    case EN_INITVOLUME:
        *value = tank->findVolume(tank->head) * vcf;
        break;
    case EN_MIXMODEL:
        *value = tank->mixingModel.type;
        break;
    case EN_MIXZONEVOL:
        *value = (tank->mixingModel.fracMixed * tank->maxVolume) * vcf;
        break;
    case EN_TANKDIAM:
        *value = tank->diameter * lcf;
        break;
    case EN_MINVOLUME:
        *value = tank->minVolume * vcf;
        break;
    case EN_VOLCURVE:
        if ( tank->volCurve )
        {
            string name = tank->volCurve->name;
            int index = nw->indexOf(Element::CURVE, name);
            *value = index;
            if ( index < 0 ) return 205;
        }
        else *value = -1.0;
        break;
    case EN_MINLEVEL:
        *value = (tank->minHead - tank->elev) * lcf;
        break;
    case EN_MAXLEVEL:
        *value = (tank->maxHead - tank->elev) * lcf;
        break;
    case EN_MIXFRACTION:
        *value = tank->mixingModel.fracMixed;
        break;
    case EN_TANK_KBULK:
        *value = tank->bulkCoeff ;
        break;
    case EN_TANKVOLUME:
        *value = tank->volume * vcf;
        break;
    default: return 203;
    }
    return 0;
}